

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O0

bool IsProDOSDisk(HDD *hdd,PRODOS_CAPS *pdc)

{
  PRODOS_CAPS *pdc_local;
  HDD *hdd_local;
  
  if (hdd->sector_size == 0x200) {
    pdc->base_sectors = 0x44;
    pdc->records = (int)((hdd->total_sectors - (long)pdc->base_sectors) / 0x800);
    pdc->bootable = false;
    hdd_local._7_1_ = CheckSig(hdd,1,0x10,"",0x10);
  }
  else {
    hdd_local._7_1_ = false;
  }
  return hdd_local._7_1_;
}

Assistant:

bool IsProDOSDisk(const HDD& hdd, PRODOS_CAPS& pdc)
{
    /*
        Sector 0    - MS-DOS BOOT sector
        Sector 1    - MS-DOS FAT
        Sector 2    - MS-DOS ROOT directory
        Sector 3    - Small "READ-ME.TXT" file visible to Windows/MS-DOS Etc.
        Sector 4-67 - Pro-DOS system code (if the card was formatted as "bootable")
        Sector 68   - CP/M "Disk" ONE start
        Sector 2116 - CP/M "Disk" TWO start
        Sector 4164 - CP/M "Disk" THREE start ... and so on.
    */
    // Sector size must be 512 bytes for PRODOS
    if (hdd.sector_size != PRODOS_SECTOR_SIZE)
        return false;

    pdc.base_sectors = PRODOS_BASE_SECTORS;
    pdc.records = static_cast<int>((hdd.total_sectors - pdc.base_sectors) / PRODOS_RECORD_SECTORS);
    pdc.bootable = false;

    return CheckSig(hdd, 1, 16, "\x00\x03\x08\x06\x08\x13\x00\x0B\x1E\x11\x04\x00\x0B\x08\x13\x18", 16);
}